

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O0

int repeat_address(int sock,uint64_t name)

{
  int iVar1;
  ssize_t sVar2;
  undefined8 in_RSI;
  int in_EDI;
  uint8_t dat [8];
  int ret;
  int in_stack_ffffffffffffffe0;
  undefined1 local_1c [8];
  int local_14;
  undefined8 local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  iVar1 = host_is_little_endian();
  if (iVar1 == 0) {
    bswap(local_1c,8);
  }
  if (s.verbose != 0) {
    fprintf(_stderr,"- send(, %ld, 8, 0);\n",local_10);
  }
  sVar2 = sendto(local_4,local_1c,8,0,(sockaddr *)&repeat_address::saddr,0x18);
  local_14 = (int)sVar2;
  iVar1 = must_warn(in_stack_ffffffffffffffe0);
  if (iVar1 != 0) {
    fprintf(_stderr,"send address claim for 0x%02x\n",(ulong)s.last_sa);
  }
  return local_14;
}

Assistant:

static int repeat_address(int sock, uint64_t name)
{
	int ret;
	uint8_t dat[8];
	static const struct sockaddr_can saddr = {
		.can_family = AF_CAN,
		.can_addr.j1939 = {
			.pgn = J1939_PGN_ADDRESS_CLAIMED,
			.addr = J1939_NO_ADDR,
		},
	};

	memcpy(dat, &name, 8);
	if (!host_is_little_endian())
		bswap(dat, 8);
	if (s.verbose)
		fprintf(stderr, "- send(, %" PRId64 ", 8, 0);\n", name);
	ret = sendto(sock, dat, sizeof(dat), 0, (const struct sockaddr *)&saddr,
		     sizeof(saddr));
	if (must_warn(ret))
		fprintf(stderr, "send address claim for 0x%02x\n", s.last_sa);
	return ret;
}